

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_SHA2_384.c
# Opt level: O0

void Hacl_Impl_SHA2_384_update_last(uint64_t *state,uint8_t *data,uint64_t len)

{
  ulong uVar1;
  undefined1 n [16];
  uint8_t *b;
  ulong uVar2;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uint8_t *buf2;
  uint8_t *buf1;
  uint32_t pad0len;
  FStar_UInt128_t encodedlen;
  uint8_t *padding;
  uint64_t n1;
  uint8_t *final_blocks;
  uint32_t nb;
  uint8_t blocks [256];
  uint32_t n1_00;
  uint8_t *in_stack_fffffffffffffe98;
  uint64_t *state_00;
  undefined1 *local_128;
  undefined1 local_118 [128];
  undefined1 auStack_98 [128];
  ulong local_18;
  void *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_118,0,0x100);
  if (local_18 < 0x70) {
    local_128 = auStack_98;
  }
  else {
    local_128 = local_118;
  }
  memcpy(local_128,local_10,local_18 & 0xffffffff);
  uVar1 = *(ulong *)(local_8 + 0x540);
  b = local_128 + (local_18 & 0xffffffff);
  uVar2 = uVar1 * 0x80;
  state_00 = (uint64_t *)(b + (ulong)(0x6fU - (int)local_18 & 0x7f) + 1);
  *b = 0x80;
  n1_00 = 0;
  n._8_8_ = in_stack_fffffffffffffe98;
  n._0_8_ = ((uVar1 >> 0x39) + (ulong)CARRY8(uVar2,local_18)) * 8 | uVar2 + local_18 >> 0x3d;
  store128_be(b,(uint128_t)n);
  Hacl_Impl_SHA2_384_update_multi(state_00,in_stack_fffffffffffffe98,n1_00);
  return;
}

Assistant:

static void Hacl_Impl_SHA2_384_update_last(uint64_t *state, uint8_t *data, uint64_t len)
{
  uint8_t blocks[256U] = { 0U };
  uint32_t nb;
  if (len < (uint64_t)112U)
    nb = (uint32_t)1U;
  else
    nb = (uint32_t)2U;
  uint8_t *final_blocks;
  if (len < (uint64_t)112U)
    final_blocks = blocks + (uint32_t)128U;
  else
    final_blocks = blocks;
  memcpy(final_blocks, data, (uint32_t)len * sizeof data[0U]);
  uint64_t n1 = state[168U];
  uint8_t *padding = final_blocks + (uint32_t)len;
  FStar_UInt128_t
  encodedlen =
    FStar_UInt128_shift_left(FStar_UInt128_add(FStar_UInt128_mul_wide(n1, (uint64_t)(uint32_t)128U),
        FStar_UInt128_uint64_to_uint128(len)),
      (uint32_t)3U);
  uint32_t
  pad0len =
    ((uint32_t)128U - ((uint32_t)len + (uint32_t)16U + (uint32_t)1U) % (uint32_t)128U)
    % (uint32_t)128U;
  uint8_t *buf1 = padding;
  uint8_t *buf2 = padding + (uint32_t)1U + pad0len;
  buf1[0U] = (uint8_t)0x80U;
  store128_be(buf2, encodedlen);
  Hacl_Impl_SHA2_384_update_multi(state, final_blocks, nb);
}